

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

int nes_system_save_state(nes_system *system,void *buffer,size_t buffer_size)

{
  size_t sVar1;
  size_t state_size;
  size_t buffer_size_local;
  void *buffer_local;
  nes_system *system_local;
  
  sVar1 = nes_system_get_state_size(system);
  if ((buffer == (void *)0x0) || (buffer_size < sVar1)) {
    system_local._4_4_ = 0;
  }
  else {
    memcpy(buffer,system,0x69ac);
    memcpy((void *)((long)buffer + 0x69ac),system->cartridge->mapper_state,
           system->cartridge->mapper->state_size);
    system_local._4_4_ = 1;
  }
  return system_local._4_4_;
}

Assistant:

int nes_system_save_state(nes_system* system, void* buffer, size_t buffer_size)
{
    size_t state_size = nes_system_get_state_size(system);
    
    if (buffer && buffer_size >= state_size)
    {
        memcpy(buffer,                                   &system->state,                    sizeof(nes_system_state));
        memcpy((char*)buffer + sizeof(nes_system_state), system->cartridge->mapper_state,  system->cartridge->mapper->state_size);
        return 1;
    }

    return 0;
}